

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

string * yactfr::internal::pseudoTypeIdenStr<yactfr::internal::PseudoDst>
                   (string *__return_storage_ptr__,PseudoDst *pseudoDst)

{
  bool bVar1;
  TypeId TVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar3
  ;
  ostream *poVar4;
  reference_const_type pbVar5;
  ostringstream local_1b8 [8];
  ostringstream ss;
  PseudoDst *pseudoDst_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  TVar2 = PseudoDst::id(pseudoDst);
  std::ostream::operator<<((ostream *)local_1b8,TVar2);
  poVar3 = PseudoDst::name_abi_cxx11_(pseudoDst);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(poVar3);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    poVar3 = PseudoDst::ns_abi_cxx11_(pseudoDst);
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(poVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_005b4b59;
  }
  std::operator<<((ostream *)local_1b8,'(');
  poVar3 = PseudoDst::name_abi_cxx11_(pseudoDst);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(poVar3);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)local_1b8,"named `");
    poVar3 = PseudoDst::name_abi_cxx11_(pseudoDst);
    pbVar5 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(poVar3);
    poVar4 = std::operator<<(poVar4,(string *)pbVar5);
    std::operator<<(poVar4,'`');
    poVar3 = PseudoDst::ns_abi_cxx11_(pseudoDst);
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(poVar3);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::operator<<((ostream *)local_1b8,' ');
    }
  }
  poVar3 = PseudoDst::ns_abi_cxx11_(pseudoDst);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(poVar3);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)local_1b8,"within namespace `");
    poVar3 = PseudoDst::ns_abi_cxx11_(pseudoDst);
    pbVar5 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(poVar3);
    poVar4 = std::operator<<(poVar4,(string *)pbVar5);
    std::operator<<(poVar4,'`');
  }
  std::operator<<((ostream *)local_1b8,')');
LAB_005b4b59:
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string pseudoTypeIdenStr(const PseudoTypeT& pseudoDst)
{
    std::ostringstream ss;

    ss << pseudoDst.id();

    if (pseudoDst.name() || pseudoDst.ns()) {
        ss << '(';

        if (pseudoDst.name()) {
            ss << "named `" << *pseudoDst.name() << '`';

            if (pseudoDst.ns()) {
                ss << ' ';
            }
        }

        if (pseudoDst.ns()) {
            ss << "within namespace `" << *pseudoDst.ns() << '`';
        }

        ss << ')';
    }

    return ss.str();
}